

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UBool collator_cleanup(void)

{
  Locale *pLVar1;
  Locale *pLVar2;
  Locale *this;
  void *in_RSI;
  
  if (gService != (ICULocaleService *)0x0) {
    if (gService != (ICULocaleService *)0x0) {
      (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    }
    gService = (ICULocaleService *)0x0;
  }
  icu_63::UInitOnce::reset(&gServiceInitOnce);
  pLVar2 = availableLocaleList;
  if (availableLocaleList != (Locale *)0x0) {
    if (availableLocaleList != (Locale *)0x0) {
      pLVar1 = availableLocaleList + -1;
      this = availableLocaleList + *(long *)&availableLocaleList[-1].fIsBogus;
      while (pLVar2 != this) {
        this = this + -1;
        icu_63::Locale::~Locale(this);
      }
      icu_63::UMemory::operator_delete__((UMemory *)&pLVar1->fIsBogus,in_RSI);
    }
    availableLocaleList = (Locale *)0x0;
  }
  availableLocaleListCount = 0;
  icu_63::UInitOnce::reset(&gAvailableLocaleListInitOnce);
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV collator_cleanup(void) {
#if !UCONFIG_NO_SERVICE
    if (gService) {
        delete gService;
        gService = NULL;
    }
    gServiceInitOnce.reset();
#endif
    if (availableLocaleList) {
        delete []availableLocaleList;
        availableLocaleList = NULL;
    }
    availableLocaleListCount = 0;
    gAvailableLocaleListInitOnce.reset();
    return TRUE;
}